

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

bool __thiscall xatlas::internal::UniformGrid2::createGrid(UniformGrid2 *this)

{
  Array<unsigned_int> *this_00;
  Vector2 *pVVar1;
  uint8_t *puVar2;
  uint32_t *puVar3;
  uint8_t *puVar4;
  undefined4 extraout_EAX;
  uint *puVar5;
  uint32_t newBufferSize;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t j;
  ulong uVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  uint32_t edge;
  uint8_t local_68 [4];
  uint local_64;
  ulong local_60;
  undefined1 local_58 [16];
  float local_48;
  
  uVar7 = (this->m_edges).m_base.size;
  uVar12 = (ulong)uVar7;
  auVar14 = _DAT_002621f0;
  auVar18 = _DAT_0023da20;
  if (uVar12 != 0) {
    puVar3 = this->m_indices;
    uVar8 = 0;
    do {
      uVar6 = *(uint *)((this->m_edges).m_base.buffer + uVar8 * 4);
      uVar11 = uVar6;
      if (puVar3 != (uint32_t *)0x0) {
        uVar11 = puVar3[uVar6];
      }
      iVar9 = uVar6 % 3 + 1;
      if (iVar9 == 3) {
        iVar9 = 0;
      }
      uVar10 = iVar9 + (uVar6 / 3) * 3;
      if (puVar3 != (uint32_t *)0x0) {
        uVar10 = puVar3[uVar10];
      }
      pVVar1 = this->m_positions + uVar11;
      auVar16._8_8_ = 0;
      auVar16._0_4_ = pVVar1->x;
      auVar16._4_4_ = pVVar1->y;
      auVar18 = minps(auVar18,auVar16);
      auVar14 = maxps(auVar14,auVar16);
      pVVar1 = this->m_positions + uVar10;
      auVar17._8_8_ = 0;
      auVar17._0_4_ = pVVar1->x;
      auVar17._4_4_ = pVVar1->y;
      auVar18 = minps(auVar18,auVar17);
      auVar14 = maxps(auVar14,auVar17);
      uVar8 = uVar8 + 1;
    } while (uVar12 != uVar8);
  }
  this->m_gridOrigin = auVar18._0_8_;
  auVar15._0_4_ = auVar14._0_4_ - auVar18._0_4_;
  auVar15._4_4_ = auVar14._4_4_ - auVar18._4_4_;
  auVar15._8_4_ = auVar14._8_4_ - auVar18._8_4_;
  auVar15._12_4_ = auVar14._12_4_ - auVar18._12_4_;
  fVar19 = auVar15._0_4_;
  if (auVar15._4_4_ <= auVar15._0_4_) {
    fVar19 = auVar15._4_4_;
  }
  fVar19 = fVar19 / SQRT((float)uVar12);
  this->m_cellSize = fVar19;
  if (0.0 < fVar19) {
    auVar14._4_4_ = fVar19;
    auVar14._0_4_ = fVar19;
    auVar14._8_4_ = fVar19;
    auVar14._12_4_ = fVar19;
    local_58 = divps(auVar15,auVar14);
    local_48 = ceilf(local_58._0_4_);
    fVar19 = ceilf((float)local_58._4_4_);
    uVar13 = (int)(local_48 - 2.1474836e+09) & (int)local_48 >> 0x1f | (int)local_48;
    uVar6 = (int)(fVar19 - 2.1474836e+09) & (int)fVar19 >> 0x1f | (int)fVar19;
    this->m_gridWidth = uVar13;
    this->m_gridHeight = uVar6;
    auVar18._0_4_ = -(uint)(uVar13 == 0);
    auVar18._4_4_ = -(uint)(uVar13 == 0);
    auVar18._8_4_ = -(uint)(uVar6 == 0);
    auVar18._12_4_ = -(uint)(uVar6 == 0);
    iVar9 = movmskpd(extraout_EAX,auVar18);
    if (iVar9 == 0) {
      uVar6 = uVar6 * uVar13;
      (this->m_cellDataOffsets).m_base.size = uVar6;
      if ((this->m_cellDataOffsets).m_base.capacity < uVar6) {
        ArrayBase::setArrayCapacity(&(this->m_cellDataOffsets).m_base,uVar6);
        uVar6 = (this->m_cellDataOffsets).m_base.size;
      }
      if (uVar6 != 0) {
        puVar4 = (this->m_cellDataOffsets).m_base.buffer;
        uVar8 = 0;
        do {
          puVar2 = puVar4 + uVar8 * 4;
          puVar2[0] = 0xff;
          puVar2[1] = 0xff;
          puVar2[2] = 0xff;
          puVar2[3] = 0xff;
          uVar8 = uVar8 + 1;
        } while (uVar8 < (this->m_cellDataOffsets).m_base.size);
      }
      this_00 = &this->m_cellData;
      (this->m_cellData).m_base.size = 0;
      uVar7 = uVar7 * 2;
      if ((this->m_cellData).m_base.capacity < uVar7) {
        ArrayBase::setArrayCapacity(&this_00->m_base,uVar7);
      }
      if (uVar12 == 0) {
        return true;
      }
      uVar8 = 0;
      local_60 = uVar12;
      while (uVar8 < (this->m_edges).m_base.size) {
        local_64 = *(uint *)((this->m_edges).m_base.buffer + uVar8 * 4);
        puVar3 = this->m_indices;
        uVar7 = local_64;
        if (puVar3 != (uint32_t *)0x0) {
          uVar7 = puVar3[local_64];
        }
        iVar9 = local_64 % 3 + 1;
        if (iVar9 == 3) {
          iVar9 = 0;
        }
        uVar6 = iVar9 + (local_64 / 3) * 3;
        if (puVar3 != (uint32_t *)0x0) {
          uVar6 = puVar3[uVar6];
        }
        traverse(this,this->m_positions[uVar7],this->m_positions[uVar6]);
        if ((this->m_traversedCellOffsets).m_base.size == 0) {
          __assert_fail("!m_traversedCellOffsets.isEmpty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                        ,0x1022,"bool xatlas::internal::UniformGrid2::createGrid()");
        }
        uVar12 = 0;
        do {
          uVar7 = *(uint *)((this->m_traversedCellOffsets).m_base.buffer + uVar12 * 4);
          if ((this->m_cellDataOffsets).m_base.size <= uVar7) goto LAB_001b102f;
          puVar4 = (this->m_cellDataOffsets).m_base.buffer;
          iVar9 = *(int *)(puVar4 + (ulong)uVar7 * 4);
          uVar6 = (this->m_cellData).m_base.size;
          if (iVar9 == -1) {
            puVar5 = (uint *)(puVar4 + (ulong)uVar7 * 4);
          }
          else {
            puVar4 = (this_00->m_base).buffer;
            do {
              uVar7 = iVar9 + 1;
              if (uVar6 <= uVar7) goto LAB_001b102f;
              iVar9 = *(int *)(puVar4 + (ulong)uVar7 * 4);
            } while (iVar9 != -1);
            puVar5 = (uint *)(puVar4 + (ulong)uVar7 * 4);
          }
          *puVar5 = uVar6;
          ArrayBase::push_back(&this_00->m_base,(uint8_t *)&local_64);
          local_68[0] = 0xff;
          local_68[1] = 0xff;
          local_68[2] = 0xff;
          local_68[3] = 0xff;
          ArrayBase::push_back(&this_00->m_base,local_68);
          uVar7 = (int)uVar12 + 1;
          uVar12 = (ulong)uVar7;
        } while (uVar7 < (this->m_traversedCellOffsets).m_base.size);
        uVar8 = uVar8 + 1;
        if (uVar8 == local_60) {
          return true;
        }
      }
LAB_001b102f:
      __assert_fail("index < m_base.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                    ,0x4ae,
                    "T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) [T = unsigned int]"
                   );
    }
  }
  return false;
}

Assistant:

bool createGrid()
	{
		// Compute edge extents. Min will be the grid origin.
		const uint32_t edgeCount = m_edges.size();
		Extents2 edgeExtents;
		edgeExtents.reset();
		for (uint32_t i = 0; i < edgeCount; i++) {
			const uint32_t edge = m_edges[i];
			edgeExtents.add(edgePosition0(edge));
			edgeExtents.add(edgePosition1(edge));
		}
		m_gridOrigin = edgeExtents.min;
		// Size grid to approximately one edge per cell.
		const Vector2 extentsSize(edgeExtents.max - edgeExtents.min);
		m_cellSize = min(extentsSize.x, extentsSize.y) / sqrtf((float)edgeCount);
		if (m_cellSize <= 0.0f)
			return false;
		m_gridWidth = uint32_t(ceilf(extentsSize.x / m_cellSize));
		m_gridHeight = uint32_t(ceilf(extentsSize.y / m_cellSize));
		if (m_gridWidth == 0 || m_gridHeight == 0)
			return false;
		// Insert edges into cells.
		m_cellDataOffsets.resize(m_gridWidth * m_gridHeight);
		for (uint32_t i = 0; i < m_cellDataOffsets.size(); i++)
			m_cellDataOffsets[i] = UINT32_MAX;
		m_cellData.clear();
		m_cellData.reserve(edgeCount * 2);
		for (uint32_t i = 0; i < edgeCount; i++) {
			const uint32_t edge = m_edges[i];
			traverse(edgePosition0(edge), edgePosition1(edge));
			XA_DEBUG_ASSERT(!m_traversedCellOffsets.isEmpty());
			for (uint32_t j = 0; j < m_traversedCellOffsets.size(); j++) {
				const uint32_t cell = m_traversedCellOffsets[j];
				uint32_t offset = m_cellDataOffsets[cell];
				if (offset == UINT32_MAX)
					m_cellDataOffsets[cell] = m_cellData.size();
				else {
					for (;;) {
						uint32_t &nextOffset = m_cellData[offset + 1];
						if (nextOffset == UINT32_MAX) {
							nextOffset = m_cellData.size();
							break;
						}
						offset = nextOffset;
					}
				}
				m_cellData.push_back(edge);
				m_cellData.push_back(UINT32_MAX);
			}
		}
		return true;
	}